

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O3

QualifiedIdentifier * __thiscall
soul::StructuralParser::parseQualifiedIdentifier(StructuralParser *this)

{
  SourceCodeText *o;
  DestructorFn *pDVar1;
  Scope *pSVar2;
  char *pcVar3;
  bool bVar4;
  PoolItem *pPVar5;
  Identifier IVar6;
  Ptr *pPVar7;
  void **this_00;
  pool_ptr<soul::AST::Expression> s;
  IdentifierPath path;
  pool_ptr<soul::AST::Expression> local_150;
  pool_ptr<soul::AST::Expression> local_148;
  undefined1 local_140 [16];
  UTF8Reader local_130;
  Ptr local_128;
  undefined1 local_120 [72];
  UTF8Reader local_d8;
  Ptr local_d0;
  Identifier local_c8 [8];
  ArrayWithPreallocation<soul::Identifier,_8UL> local_88;
  
  o = (this->super_SOULTokeniser).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pDVar1 = (DestructorFn *)(this->super_SOULTokeniser).location.location.data;
  pSVar2 = this->currentScope;
  pPVar5 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0xa0);
  *(undefined4 *)&pPVar5->field_0x18 = 0x26;
  pPVar5[1].size = (size_t)o;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  pPVar5[1].destructor = pDVar1;
  pPVar5[1].item = pSVar2;
  *(undefined4 *)&pPVar5[1].field_0x18 = 4;
  pPVar5->item = &PTR__QualifiedIdentifier_002f5f48;
  pPVar5[2].size = 0;
  pPVar5[2].destructor = (DestructorFn *)0x0;
  pPVar5[2].item = (void *)0x0;
  *(void ***)&pPVar5[2].field_0x18 = &pPVar5[3].item;
  pPVar5[3].size = 0;
  pPVar5[3].destructor = (DestructorFn *)0x8;
  pPVar5->destructor =
       PoolAllocator::allocate<soul::AST::QualifiedIdentifier,_soul::AST::Context>::
       anon_class_1_0_00000001::__invoke;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
  this_00 = &pPVar5->item;
  do {
    IVar6 = parseIdentifier(this);
    IdentifierPath::IdentifierPath((IdentifierPath *)&local_88,IVar6);
    while( true ) {
      bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d8da);
      if (!bVar4) break;
      IVar6 = parseIdentifier(this);
      IdentifierPath::addSuffix((IdentifierPath *)&local_88,IVar6);
    }
    pcVar3 = (this->super_SOULTokeniser).location.location.data;
    parseSpecialisationArgs((StructuralParser *)local_140);
    bVar4 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x27d8da);
    if (bVar4) {
      ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
                ((ArrayWithPreallocation<soul::Identifier,_8UL> *)(local_120 + 0x40),&local_88);
      local_148.object = (Expression *)local_140._0_8_;
      AST::QualifiedIdentifier::addToPath
                ((QualifiedIdentifier *)this_00,(IdentifierPath *)(local_120 + 0x40),&local_148);
      local_d8.data = (char *)0x0;
      if ((SourceCodeText *)0x8 < local_d0.object) {
        if ((Identifier *)local_120._64_8_ != (Identifier *)0x0) {
          operator_delete__((void *)local_120._64_8_);
        }
        local_120._64_8_ = local_c8;
        pPVar7 = &local_d0;
LAB_001f006a:
        pPVar7->object = (SourceCodeText *)0x8;
      }
    }
    else {
      if ((this->super_SOULTokeniser).input.data != pcVar3) {
        (this->super_SOULTokeniser).input.data = pcVar3;
        Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
        ::skip(&this->super_SOULTokeniser);
      }
      ArrayWithPreallocation<soul::Identifier,_8UL>::ArrayWithPreallocation
                ((ArrayWithPreallocation<soul::Identifier,_8UL> *)(local_140 + 8),&local_88);
      local_150.object = (Expression *)0x0;
      AST::QualifiedIdentifier::addToPath
                ((QualifiedIdentifier *)this_00,(IdentifierPath *)(local_140 + 8),&local_150);
      local_130.data = (char *)0x0;
      if ((SourceCodeText *)0x8 < local_128.object) {
        if ((SourceCodeText *)local_140._8_8_ != (SourceCodeText *)0x0) {
          operator_delete__((void *)local_140._8_8_);
        }
        local_140._8_8_ = local_120;
        pPVar7 = &local_128;
        goto LAB_001f006a;
      }
    }
    local_88.numActive = 0;
    if ((8 < local_88.numAllocated) && (local_88.items != (Identifier *)0x0)) {
      operator_delete__(local_88.items);
    }
    if (!bVar4) {
      return (QualifiedIdentifier *)this_00;
    }
  } while( true );
}

Assistant:

AST::QualifiedIdentifier& parseQualifiedIdentifier()
    {
        auto& qi = allocate<AST::QualifiedIdentifier> (getContext());

        for (;;)
        {
            IdentifierPath path (parseIdentifier());

            while (matchIf (Operator::doubleColon))
                path.addSuffix (parseIdentifier());

            auto p = getCurrentTokeniserPosition();
            auto s = parseSpecialisationArgs();

            if (matchIf (Operator::doubleColon))
            {
                qi.addToPath (path, s);
                continue;
            }

            resetPosition (p);
            qi.addToPath (path, nullptr);
            return qi;
        }
    }